

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resldexe.cpp
# Opt level: O0

void __thiscall
CVmImageLoaderMres_resload::add_resource
          (CVmImageLoaderMres_resload *this,uint32_t seek_ofs,uint32_t siz,char *res_name,
          size_t res_name_len)

{
  int iVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  long in_R8;
  void *in_stack_00000028;
  void *in_stack_00000030;
  
  if (((*(int *)(in_RDI + 0x18) == 0) && (in_R8 == *(long *)(in_RDI + 0x10))) &&
     (iVar1 = memicmp(in_stack_00000030,in_stack_00000028,(size_t)this), iVar1 == 0)) {
    *(undefined4 *)(in_RDI + 0x18) = 1;
    *(undefined4 *)(in_RDI + 0x1c) = in_ESI;
    *(undefined4 *)(in_RDI + 0x20) = in_EDX;
  }
  return;
}

Assistant:

void add_resource(uint32_t seek_ofs, uint32_t siz,
                      const char *res_name, size_t res_name_len)
    {
        /* 
         *   if we've already found a match, there's no need to consider
         *   anything else 
         */
        if (found_)
            return;

        /* check to see if this is the one we're looking for */
        if (res_name_len == respath_len_
            && memicmp(respath_, res_name, res_name_len) == 0)
        {
            /* we found it */
            found_ = TRUE;

            /* remember the seek location */
            res_seek_ = seek_ofs;
            res_size_ = siz;
        }
    }